

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

int main(int ac,char **av)

{
  int ac_00;
  int iVar1;
  int ret;
  undefined1 local_30 [8];
  CommandLineArguments args;
  char **av_local;
  int ac_local;
  
  args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = av;
  cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)local_30,ac,av);
  ac_00 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)local_30);
  args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)local_30);
  cmsys::SystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources
            (*args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (1 < ac_00) {
    iVar1 = strcmp(args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[1],"--build");
    if (iVar1 == 0) {
      av_local._4_4_ =
           do_build(ac_00,args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      goto LAB_0042e32c;
    }
    iVar1 = strcmp(args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[1],"-E");
    if (iVar1 == 0) {
      av_local._4_4_ =
           do_command(ac_00,args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      goto LAB_0042e32c;
    }
  }
  av_local._4_4_ =
       do_cmake(ac_00,args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cmDynamicLoader::FlushCache();
LAB_0042e32c:
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_30);
  return av_local._4_4_;
}

Assistant:

int main(int ac, char const* const* av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  ac = args.argc();
  av = args.argv();

  cmSystemTools::EnableMSVCDebugHook();
  cmSystemTools::FindCMakeResources(av[0]);
  if(ac > 1)
    {
    if(strcmp(av[1], "--build") == 0)
      {
      return do_build(ac, av);
      }
    else if(strcmp(av[1], "-E") == 0)
      {
      return do_command(ac, av);
      }
    }
  int ret = do_cmake(ac, av);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmDynamicLoader::FlushCache();
#endif
  return ret;
}